

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaDedicatedAllocationList::BuildStatsString(VmaDedicatedAllocationList *this,VmaJsonWriter *json)

{
  bool bVar1;
  ItemType *this_00;
  
  bVar1 = this->m_UseMutex;
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  VmaJsonWriter::BeginArray(json,false);
  for (this_00 = (this->m_AllocationList).m_Front; this_00 != (VmaAllocation_T *)0x0;
      this_00 = (this_00->field_0).m_DedicatedAllocation.m_Next) {
    VmaJsonWriter::BeginObject(json,true);
    VmaAllocation_T::PrintParameters(this_00,json);
    VmaJsonWriter::EndObject(json);
  }
  VmaJsonWriter::EndArray(json);
  if (bVar1 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
    return;
  }
  return;
}

Assistant:

void VmaDedicatedAllocationList::BuildStatsString(VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    json.BeginArray();
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        json.BeginObject(true);
        alloc->PrintParameters(json);
        json.EndObject();
    }
    json.EndArray();
}